

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O2

void __thiscall
Cgmres<Model>::init_u0_newton(Cgmres<Model> *this,double *u0,double *x0,double *p0,uint16_t n_loop)

{
  bool bVar1;
  double lmd0 [4];
  double vec [6];
  double mat [36];
  
  Model::dPhidx(lmd0,x0,p0);
  while (bVar1 = n_loop != 0, n_loop = n_loop - 1, bVar1) {
    Model::dHdu(vec,x0,u0,p0,lmd0);
    Model::ddHduu(mat,x0,u0,p0,lmd0);
    linsolve(vec,mat,6);
    sub(u0,u0,vec,6);
  }
  init_u0(this,u0);
  return;
}

Assistant:

void init_u0_newton(double* u0, const double* x0, const double* p0, const uint16_t n_loop) {
    double lmd0[dim_x], vec[dim_u], mat[dim_u * dim_u];

    Model::dPhidx(lmd0, x0, p0);

    // u0 = u0 - dHduu \ dHdu
    for (uint16_t i = 0; i < n_loop; i++) {
      Model::dHdu(vec, x0, u0, p0, lmd0);
      Model::ddHduu(mat, x0, u0, p0, lmd0);
      linsolve(vec, mat, dim_u);

      sub(u0, u0, vec, dim_u);
    }

    init_u0(u0);
  }